

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_d9e5a4::HandleRemoveAtCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer plVar1;
  ulong uVar2;
  undefined8 name;
  cmExecutionStatus *pcVar3;
  bool bVar4;
  size_type sVar5;
  const_reference pvVar6;
  cmMakefile *pcVar7;
  cmList *pcVar8;
  pointer plVar9;
  iterator first;
  iterator last;
  out_of_range *e;
  string local_2a8;
  string_view local_288;
  long local_278;
  string local_270;
  int local_24c;
  undefined1 local_248 [4];
  int index;
  vector<long,_std::allocator<long>_> removed;
  size_t cc;
  string local_220;
  ulong local_200;
  size_t i;
  ostringstream str;
  undefined1 local_80 [8];
  optional<cmList> list;
  string *listName;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar3 = local_20;
  if (sVar5 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"sub-command REMOVE_AT requires at least two arguments.",
               &local_41);
    cmExecutionStatus::SetError(pcVar3,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
    goto LAB_00704188;
  }
  pvVar6 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,1);
  list.super__Optional_base<cmList,_false,_false>._M_payload.
  super__Optional_payload<cmList,_true,_false,_false>.super__Optional_payload_base<cmList>._24_8_ =
       pvVar6;
  pcVar7 = cmExecutionStatus::GetMakefile(local_20);
  GetList((optional<cmList> *)local_80,pvVar6,pcVar7);
  bVar4 = std::optional::operator_cast_to_bool((optional *)local_80);
  if (bVar4) {
    pcVar8 = std::optional<cmList>::operator->((optional<cmList> *)local_80);
    bVar4 = cmList::empty(pcVar8);
    if (bVar4) goto LAB_00703c5a;
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)local_248);
    for (removed.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage = (pointer)0x2;
        plVar1 = removed.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
        plVar9 = (pointer)std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)status_local), plVar1 < plVar9;
        removed.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             (pointer)((long)removed.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 1)) {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,
                            (size_type)
                            removed.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      pcVar7 = cmExecutionStatus::GetMakefile(local_20);
      bVar4 = GetIndexArg(pvVar6,&local_24c,pcVar7);
      pcVar3 = local_20;
      if (!bVar4) {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,
                              (size_type)
                              removed.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
        cmStrCat<char_const(&)[8],std::__cxx11::string_const&,char_const(&)[22]>
                  (&local_270,(char (*) [8])0x11182ee,pvVar6,(char (*) [22])0x115d912);
        cmExecutionStatus::SetError(pcVar3,&local_270);
        std::__cxx11::string::~string((string *)&local_270);
        args_local._7_1_ = 0;
        goto LAB_00704156;
      }
      local_278 = (long)local_24c;
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)local_248,&local_278);
    }
    pcVar7 = cmExecutionStatus::GetMakefile(local_20);
    name = list.super__Optional_base<cmList,_false,_false>._M_payload.
           super__Optional_payload<cmList,_true,_false,_false>.super__Optional_payload_base<cmList>.
           _24_8_;
    pcVar8 = std::optional<cmList>::operator->((optional<cmList> *)local_80);
    first = std::vector<long,_std::allocator<long>_>::begin
                      ((vector<long,_std::allocator<long>_> *)local_248);
    last = std::vector<long,_std::allocator<long>_>::end
                     ((vector<long,_std::allocator<long>_> *)local_248);
    pcVar8 = cmList::
             remove_items<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
                       (pcVar8,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                               )first._M_current,
                        (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                        last._M_current);
    cmList::to_string_abi_cxx11_(&local_2a8,pcVar8);
    local_288 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2a8);
    cmMakefile::AddDefinition(pcVar7,(string *)name,local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    args_local._7_1_ = 1;
LAB_00704156:
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)local_248);
  }
  else {
LAB_00703c5a:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&i);
    std::operator<<((ostream *)&i,"index: ");
    for (local_200 = 1; uVar2 = local_200,
        sVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local), uVar2 < sVar5; local_200 = local_200 + 1) {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,local_200);
      std::operator<<((ostream *)&i,(string *)pvVar6);
      uVar2 = local_200;
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)status_local);
      if (uVar2 != sVar5 - 1) {
        std::operator<<((ostream *)&i,", ");
      }
    }
    std::operator<<((ostream *)&i," out of range (0, 0)");
    pcVar3 = local_20;
    std::__cxx11::ostringstream::str();
    cmExecutionStatus::SetError(pcVar3,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    args_local._7_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&i);
  }
  std::optional<cmList>::~optional((optional<cmList> *)local_80);
LAB_00704188:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleRemoveAtCommand(std::vector<std::string> const& args,
                           cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("sub-command REMOVE_AT requires at least "
                    "two arguments.");
    return false;
  }

  const std::string& listName = args[1];
  // expand the variable
  auto list = GetList(listName, status.GetMakefile());

  if (!list || list->empty()) {
    std::ostringstream str;
    str << "index: ";
    for (size_t i = 1; i < args.size(); ++i) {
      str << args[i];
      if (i != args.size() - 1) {
        str << ", ";
      }
    }
    str << " out of range (0, 0)";
    status.SetError(str.str());
    return false;
  }

  size_t cc;
  std::vector<cmList::index_type> removed;
  for (cc = 2; cc < args.size(); ++cc) {
    int index;
    if (!GetIndexArg(args[cc], &index, status.GetMakefile())) {
      status.SetError(cmStrCat("index: ", args[cc], " is not a valid index"));
      return false;
    }
    removed.push_back(index);
  }

  try {
    status.GetMakefile().AddDefinition(
      listName,
      list->remove_items(removed.begin(), removed.end()).to_string());
    return true;
  } catch (std::out_of_range& e) {
    status.SetError(e.what());
    return false;
  }
}